

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::AllocateExternalObject_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *executeContext_00;
  TTDVar origVar;
  Var local_38;
  Var res;
  Var prototype;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  ctx = (ScriptContext *)executeContext;
  executeContext_local = (ThreadContextTTD *)evt;
  action = (JsRTSingleVarArgumentAction *)ThreadContextTTD::GetActiveScriptContext(executeContext);
  if ((ScriptContext *)action == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  prototype = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)36>
                        ((EventLogEntry *)executeContext_local);
  executeContext_00 = ctx;
  origVar = GetVarItem_0<1ul>((JsRTVarsArgumentAction_InternalUse<1UL> *)prototype);
  res = InflateVarInReplay((ThreadContextTTD *)executeContext_00,origVar);
  local_38 = (Var)0x0;
  (*(code *)(ctx->generalAllocator).
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.largestHole)
            (action,res,&local_38);
  JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)36>
            ((ThreadContextTTD *)ctx,(EventLogEntry *)executeContext_local,local_38);
  return;
}

Assistant:

void AllocateExternalObject_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::AllocateExternalObjectActionTag>(evt);
            Js::Var prototype = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::Var res = nullptr;
            executeContext->TTDExternalObjectFunctions.pfCreateExternalObject(ctx, prototype, &res);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::AllocateExternalObjectActionTag>(executeContext, evt, res);
        }